

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XCoreDisassembler.c
# Opt level: O0

DecodeStatus Decode2OpInstruction(uint Insn,uint *Op1,uint *Op2)

{
  uint32_t uVar1;
  uint32_t local_2c;
  uint Combined;
  uint Op2High;
  uint Op1High;
  uint *Op2_local;
  uint *Op1_local;
  uint Insn_local;
  
  local_2c = fieldFromInstruction_4(Insn,6,5);
  if (local_2c < 0x1b) {
    Op1_local._4_4_ = MCDisassembler_Fail;
  }
  else {
    uVar1 = fieldFromInstruction_4(Insn,5,1);
    if (uVar1 != 0) {
      if (local_2c == 0x1f) {
        return MCDisassembler_Fail;
      }
      local_2c = local_2c + 5;
    }
    uVar1 = fieldFromInstruction_4(Insn,2,2);
    *Op1 = (local_2c - 0x1b) % 3 << 2 | uVar1;
    uVar1 = fieldFromInstruction_4(Insn,0,2);
    *Op2 = (local_2c - 0x1b) / 3 << 2 | uVar1;
    Op1_local._4_4_ = MCDisassembler_Success;
  }
  return Op1_local._4_4_;
}

Assistant:

static DecodeStatus Decode2OpInstruction(unsigned Insn, unsigned *Op1, unsigned *Op2)
{
	unsigned Op1High, Op2High;
	unsigned Combined = fieldFromInstruction_4(Insn, 6, 5);

	if (Combined < 27)
		return MCDisassembler_Fail;

	if (fieldFromInstruction_4(Insn, 5, 1)) {
		if (Combined == 31)
			return MCDisassembler_Fail;
		Combined += 5;
	}

	Combined -= 27;
	Op1High = Combined % 3;
	Op2High = Combined / 3;
	*Op1 = (Op1High << 2) | fieldFromInstruction_4(Insn, 2, 2);
	*Op2 = (Op2High << 2) | fieldFromInstruction_4(Insn, 0, 2);

	return MCDisassembler_Success;
}